

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_ldm.c
# Opt level: O0

size_t ZSTD_ldm_getTableSize(ldmParams_t params)

{
  byte bVar1;
  int in_stack_00000008;
  uint in_stack_0000000c;
  size_t local_40;
  byte local_34;
  size_t totalSize;
  size_t ldmBucketSize;
  size_t ldmBucketSizeLog;
  size_t ldmHSize;
  
  bVar1 = (byte)in_stack_0000000c;
  local_34 = bVar1;
  if (params.enableLdm < in_stack_0000000c) {
    local_34 = (byte)params.enableLdm;
  }
  local_40 = (1L << (bVar1 - local_34 & 0x3f)) + (1L << (bVar1 & 0x3f)) * 8;
  if (in_stack_00000008 == 0) {
    local_40 = 0;
  }
  return local_40;
}

Assistant:

size_t ZSTD_ldm_getTableSize(ldmParams_t params)
{
    size_t const ldmHSize = ((size_t)1) << params.hashLog;
    size_t const ldmBucketSizeLog = MIN(params.bucketSizeLog, params.hashLog);
    size_t const ldmBucketSize =
        ((size_t)1) << (params.hashLog - ldmBucketSizeLog);
    size_t const totalSize = ldmBucketSize + ldmHSize * sizeof(ldmEntry_t);
    return params.enableLdm ? totalSize : 0;
}